

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::Desugarer::desugarFields(jsonnet::internal::AST*,std::vector<jsonnet::internal::
ObjectField,std::allocator<jsonnet::internal::ObjectField>>&,unsigned_int)::SubstituteSelfSuper::
visitExpr(jsonnet::internal::AST___(void *this,AST **expr)

{
  uint uVar1;
  Desugarer *pDVar2;
  long lVar3;
  Identifier *pIVar4;
  Var *pVVar5;
  SuperIndex *pSVar6;
  InSuper *pIVar7;
  AST *pAVar8;
  Identifier *super_var;
  UStringStream ss;
  Identifier *in_super_var;
  InSuper *local_78;
  UString local_70;
  UString local_50;
  Identifier *local_30;
  SuperIndex *local_28;
  
  pAVar8 = *expr;
  if (pAVar8 != (AST *)0x0) {
    lVar3 = __dynamic_cast(pAVar8,&AST::typeinfo,&Self::typeinfo,0);
    if (lVar3 == 0) {
      pSVar6 = (SuperIndex *)__dynamic_cast(pAVar8,&AST::typeinfo,&SuperIndex::typeinfo,0);
      local_28 = pSVar6;
      if (pSVar6 == (SuperIndex *)0x0) {
        local_78 = (InSuper *)__dynamic_cast(pAVar8,&AST::typeinfo,&InSuper::typeinfo,0);
        if (local_78 == (InSuper *)0x0) goto LAB_001e3761;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = L'\0';
        ::std::__cxx11::
        basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::append
                  (&local_70,L"$outer_in_super");
        uVar1 = **(uint **)((long)this + 0x20);
        **(uint **)((long)this + 0x20) = uVar1 + 1;
        UStringStream::operator<<((UStringStream *)&local_70,uVar1);
        pDVar2 = *(Desugarer **)((long)this + 0x10);
        ::std::__cxx11::u32string::u32string((u32string *)&local_50,&local_70);
        pIVar4 = Desugarer::id(pDVar2,&local_50);
        ::std::__cxx11::u32string::~u32string((u32string *)&local_50);
        local_30 = pIVar4;
        ::std::
        vector<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>>>
        ::emplace_back<jsonnet::internal::Identifier_const*&,jsonnet::internal::InSuper*&>
                  (*(vector<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>>>
                     **)((long)this + 0x18),&local_30,&local_78);
        pVVar5 = Allocator::
                 make<jsonnet::internal::Var,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&>
                           (*(Allocator **)((long)this + 8),&(*expr)->location,&(*expr)->openFodder,
                            &local_30);
      }
      else {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = L'\0';
        ::std::__cxx11::
        basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::append
                  (&local_70,L"$outer_super_index");
        uVar1 = **(uint **)((long)this + 0x20);
        **(uint **)((long)this + 0x20) = uVar1 + 1;
        UStringStream::operator<<((UStringStream *)&local_70,uVar1);
        pDVar2 = *(Desugarer **)((long)this + 0x10);
        ::std::__cxx11::u32string::u32string((u32string *)&local_50,&local_70);
        pIVar7 = (InSuper *)Desugarer::id(pDVar2,&local_50);
        ::std::__cxx11::u32string::~u32string((u32string *)&local_50);
        local_78 = pIVar7;
        if (pSVar6->index == (AST *)0x0) {
          __assert_fail("super_index->index != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/desugarer.cpp"
                        ,0x170,
                        "virtual void jsonnet::internal::Desugarer::desugarFields(AST *, ObjectFields &, unsigned int)::SubstituteSelfSuper::visitExpr(AST *&)"
                       );
        }
        ::std::
        vector<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>>>
        ::emplace_back<jsonnet::internal::Identifier_const*&,jsonnet::internal::SuperIndex*&>
                  (*(vector<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>>>
                     **)((long)this + 0x18),(Identifier **)&local_78,&local_28);
        pVVar5 = Allocator::
                 make<jsonnet::internal::Var,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&>
                           (*(Allocator **)((long)this + 8),&(*expr)->location,&(*expr)->openFodder,
                            (Identifier **)&local_78);
      }
      *expr = &pVVar5->super_AST;
      ::std::__cxx11::u32string::~u32string((u32string *)&local_70);
    }
    else {
      if (*(long *)((long)this + 0x28) == 0) {
        pDVar2 = *(Desugarer **)((long)this + 0x10);
        ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
                  ((u32string *)&local_70,L"$outer_self",(allocator<char32_t> *)&local_50);
        pIVar4 = Desugarer::id(pDVar2,&local_70);
        *(Identifier **)((long)this + 0x28) = pIVar4;
        ::std::__cxx11::u32string::~u32string((u32string *)&local_70);
        local_70._M_dataplus._M_p = (pointer)0x0;
        ::std::
        vector<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>>>
        ::emplace_back<jsonnet::internal::Identifier_const*&,decltype(nullptr)>
                  (*(vector<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>>>
                     **)((long)this + 0x18),(Identifier **)((long)this + 0x28),(void **)&local_70);
        pAVar8 = *expr;
      }
      pVVar5 = Allocator::
               make<jsonnet::internal::Var,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&>
                         (*(Allocator **)((long)this + 8),&pAVar8->location,&pAVar8->openFodder,
                          (Identifier **)((long)this + 0x28));
      *expr = &pVVar5->super_AST;
    }
  }
LAB_001e3761:
  CompilerPass::visitExpr((CompilerPass *)this,expr);
  return;
}

Assistant:

void visitExpr(AST *&expr)
            {
                if (dynamic_cast<Self *>(expr)) {
                    if (newSelf == nullptr) {
                        newSelf = desugarer->id(U"$outer_self");
                        superVars.emplace_back(newSelf, nullptr);
                    }
                    expr = alloc.make<Var>(expr->location, expr->openFodder, newSelf);
                } else if (auto *super_index = dynamic_cast<SuperIndex *>(expr)) {
                    UStringStream ss;
                    ss << U"$outer_super_index" << (counter++);
                    const Identifier *super_var = desugarer->id(ss.str());
                    // Desugaring of expr should already have occurred.
                    assert(super_index->index != nullptr);
                    // Re-use super_index since we're replacing it here.
                    superVars.emplace_back(super_var, super_index);
                    expr = alloc.make<Var>(expr->location, expr->openFodder, super_var);
                } else if (auto *in_super = dynamic_cast<InSuper *>(expr)) {
                    UStringStream ss;
                    ss << U"$outer_in_super" << (counter++);
                    const Identifier *in_super_var = desugarer->id(ss.str());
                    // Re-use in_super since we're replacing it here.
                    superVars.emplace_back(in_super_var, in_super);
                    expr = alloc.make<Var>(expr->location, expr->openFodder, in_super_var);
                }
                CompilerPass::visitExpr(expr);
            }